

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t do_uncompress_block(archive_read *a,uint8_t *p)

{
  long lVar1;
  uint8_t uVar2;
  wchar_t wVar3;
  uint uVar4;
  uint16_t local_76;
  wchar_t len_1;
  wchar_t wStack_70;
  uint16_t len_slot;
  wchar_t dist_1;
  wchar_t idx;
  wchar_t add_1;
  wchar_t wStack_60;
  uint16_t low_dist;
  uint32_t add;
  wchar_t dist;
  wchar_t dbits;
  wchar_t len;
  uint16_t dist_slot;
  int64_t write_idx;
  compressed_block_header *pcStack_40;
  uint8_t bit_size;
  compressed_block_header *hdr;
  uint64_t cmask;
  wchar_t ret;
  uint16_t num;
  rar5 *rar;
  uint8_t *p_local;
  archive_read *a_local;
  
  rar = (rar5 *)p;
  p_local = (uint8_t *)a;
  _ret = get_context(a);
  hdr = (compressed_block_header *)(_ret->cstate).window_mask;
  pcStack_40 = &_ret->last_block_hdr;
  uVar2 = bf_bit_size(pcStack_40);
  write_idx._7_1_ = uVar2 + 1;
  while( true ) {
    while( true ) {
      while( true ) {
        if ((_ret->cstate).window_size >> 1 <
            (_ret->cstate).write_ptr - (_ret->cstate).last_write_ptr) {
          return L'\0';
        }
        if (((_ret->cstate).cur_block_size + -1 < (long)(_ret->bits).in_addr) ||
           (((long)(_ret->bits).in_addr == (_ret->cstate).cur_block_size + -1 &&
            ((int)(uint)write_idx._7_1_ <= (int)(_ret->bits).bit_addr)))) {
          *(byte *)&_ret->cstate = *(byte *)&_ret->cstate & 0xf7 | 8;
          return L'\0';
        }
        wVar3 = decode_number((archive_read *)p_local,&(_ret->cstate).ld,(uint8_t *)rar,
                              (uint16_t *)((long)&cmask + 6));
        if (wVar3 != L'\0') {
          return L'\x01';
        }
        if (0xff < cmask._6_2_) break;
        lVar1 = (_ret->cstate).write_ptr;
        (_ret->cstate).write_ptr = lVar1 + 1;
        _len = (_ret->cstate).solid_offset + lVar1;
        (_ret->cstate).window_buf[_len & (ulong)hdr] = (uint8_t)cmask._6_2_;
      }
      if (0x105 < cmask._6_2_) break;
      if (cmask._6_2_ == 0x100) {
        wVar3 = parse_filter((archive_read *)p_local,(uint8_t *)rar);
        if (wVar3 != L'\0') {
          return wVar3;
        }
        cmask._0_4_ = L'\0';
      }
      else if (cmask._6_2_ == 0x101) {
        if (((_ret->cstate).last_len != L'\0') &&
           (wVar3 = copy_string((archive_read *)p_local,(_ret->cstate).last_len,
                                (_ret->cstate).dist_cache[0]), wVar3 != L'\0')) {
          return L'\xffffffe2';
        }
      }
      else {
        wStack_70 = (uint)cmask._6_2_ + L'\xfffffefe';
        len_1 = dist_cache_touch(_ret,wStack_70);
        wVar3 = decode_number((archive_read *)p_local,&(_ret->cstate).rd,(uint8_t *)rar,&local_76);
        if (wVar3 != L'\0') {
          return L'\xffffffe2';
        }
        wVar3 = decode_code_length((archive_read *)p_local,_ret,(uint8_t *)rar,local_76);
        if (wVar3 == L'\xffffffff') {
          return L'\xffffffe2';
        }
        (_ret->cstate).last_len = wVar3;
        wVar3 = copy_string((archive_read *)p_local,wVar3,len_1);
        if (wVar3 != L'\0') {
          return L'\xffffffe2';
        }
      }
    }
    dist = decode_code_length((archive_read *)p_local,_ret,(uint8_t *)rar,cmask._6_2_ - 0x106);
    wStack_60 = 1;
    if (dist == L'\xffffffff') {
      archive_set_error((archive *)p_local,0x16,"Failed to decode the code length");
      return L'\xffffffe2';
    }
    wVar3 = decode_number((archive_read *)p_local,&(_ret->cstate).dd,(uint8_t *)rar,
                          (uint16_t *)((long)&dbits + 2));
    if (wVar3 != L'\0') break;
    if (dbits._2_2_ < 4) {
      add = 0;
      uVar4 = (uint)dbits._2_2_;
    }
    else {
      add = dbits._2_2_ / 2 - 1;
      uVar4 = (dbits._2_2_ & 1 | 2) << ((byte)add & 0x1f);
    }
    wStack_60 = uVar4 + wStack_60;
    if (0 < (int)add) {
      if ((int)add < 4) {
        wVar3 = read_consume_bits((archive_read *)p_local,_ret,(uint8_t *)rar,add,&dist_1);
        if (wVar3 != L'\0') {
          return wVar3;
        }
        wStack_60 = dist_1 + wStack_60;
        cmask._0_4_ = L'\0';
      }
      else {
        add_1 = L'\0';
        if (4 < (int)add) {
          cmask._0_4_ = read_bits_32((archive_read *)p_local,_ret,(uint8_t *)rar,(uint32_t *)&add_1)
          ;
          if ((wchar_t)cmask != L'\0') {
            return (wchar_t)cmask;
          }
          skip_bits(_ret,add + L'\xfffffffc');
          add_1 = ((uint)add_1 >> (0x24U - (char)add & 0x1f)) * 0x10;
          wStack_60 = add_1 + wStack_60;
        }
        wVar3 = decode_number((archive_read *)p_local,&(_ret->cstate).ldd,(uint8_t *)rar,
                              (uint16_t *)((long)&idx + 2));
        if (wVar3 != L'\0') {
          archive_set_error((archive *)p_local,0x16,"Failed to decode the distance slot");
          return L'\xffffffe2';
        }
        if (L'\x7ffffffe' - (uint)idx._2_2_ <= wStack_60) {
          archive_set_error((archive *)p_local,0x54,"Distance pointer overflow");
          return L'\xffffffe2';
        }
        wStack_60 = (uint)idx._2_2_ + wStack_60;
      }
    }
    wVar3 = dist;
    if (((L'Ā' < wStack_60) && (wVar3 = dist + L'\x01', L'\x2000' < wStack_60)) &&
       (wVar3 = dist + L'\x02', L'\x00040000' < wStack_60)) {
      wVar3 = dist + L'\x03';
    }
    dist = wVar3;
    dist_cache_push(_ret,wStack_60);
    (_ret->cstate).last_len = dist;
    wVar3 = copy_string((archive_read *)p_local,dist,wStack_60);
    if (wVar3 != L'\0') {
      return L'\xffffffe2';
    }
  }
  archive_set_error((archive *)p_local,0x16,"Failed to decode the distance slot");
  return L'\xffffffe2';
}

Assistant:

static int do_uncompress_block(struct archive_read* a, const uint8_t* p) {
	struct rar5* rar = get_context(a);
	uint16_t num;
	int ret;

	const uint64_t cmask = rar->cstate.window_mask;
	const struct compressed_block_header* hdr = &rar->last_block_hdr;
	const uint8_t bit_size = 1 + bf_bit_size(hdr);

	while(1) {
		if(rar->cstate.write_ptr - rar->cstate.last_write_ptr >
		    (rar->cstate.window_size >> 1)) {
			/* Don't allow growing data by more than half of the
			 * window size at a time. In such case, break the loop;
			 *  next call to this function will continue processing
			 *  from this moment. */
			break;
		}

		if(rar->bits.in_addr > rar->cstate.cur_block_size - 1 ||
		    (rar->bits.in_addr == rar->cstate.cur_block_size - 1 &&
		    rar->bits.bit_addr >= bit_size))
		{
			/* If the program counter is here, it means the
			 * function has finished processing the block. */
			rar->cstate.block_parsing_finished = 1;
			break;
		}

		/* Decode the next literal. */
		if(ARCHIVE_OK != decode_number(a, &rar->cstate.ld, p, &num)) {
			return ARCHIVE_EOF;
		}

		/* Num holds a decompression literal, or 'command code'.
		 *
		 * - Values lower than 256 are just bytes. Those codes
		 *   can be stored in the output buffer directly.
		 *
		 * - Code 256 defines a new filter, which is later used to
		 *   ransform the data block accordingly to the filter type.
		 *   The data block needs to be fully uncompressed first.
		 *
		 * - Code bigger than 257 and smaller than 262 define
		 *   a repetition pattern that should be copied from
		 *   an already uncompressed chunk of data.
		 */

		if(num < 256) {
			/* Directly store the byte. */
			int64_t write_idx = rar->cstate.solid_offset +
			    rar->cstate.write_ptr++;

			rar->cstate.window_buf[write_idx & cmask] =
			    (uint8_t) num;
			continue;
		} else if(num >= 262) {
			uint16_t dist_slot;
			int len = decode_code_length(a, rar, p, num - 262),
				dbits,
				dist = 1;

			if(len == -1) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_PROGRAMMER,
				    "Failed to decode the code length");

				return ARCHIVE_FATAL;
			}

			if(ARCHIVE_OK != decode_number(a, &rar->cstate.dd, p,
			    &dist_slot))
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_PROGRAMMER,
				    "Failed to decode the distance slot");

				return ARCHIVE_FATAL;
			}

			if(dist_slot < 4) {
				dbits = 0;
				dist += dist_slot;
			} else {
				dbits = dist_slot / 2 - 1;

				/* Cast to uint32_t will make sure the shift
				 * left operation won't produce undefined
				 * result. Then, the uint32_t type will
				 * be implicitly casted to int. */
				dist += (uint32_t) (2 |
				    (dist_slot & 1)) << dbits;
			}

			if(dbits > 0) {
				if(dbits >= 4) {
					uint32_t add = 0;
					uint16_t low_dist;

					if(dbits > 4) {
						if(ARCHIVE_OK != (ret = read_bits_32(
						    a, rar, p, &add))) {
							/* Return EOF if we
							 * can't read more
							 * data. */
							return ret;
						}

						skip_bits(rar, dbits - 4);
						add = (add >> (
						    36 - dbits)) << 4;
						dist += add;
					}

					if(ARCHIVE_OK != decode_number(a,
					    &rar->cstate.ldd, p, &low_dist))
					{
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_PROGRAMMER,
						    "Failed to decode the "
						    "distance slot");

						return ARCHIVE_FATAL;
					}

					if(dist >= INT_MAX - low_dist - 1) {
						/* This only happens in
						 * invalid archives. */
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Distance pointer "
						    "overflow");
						return ARCHIVE_FATAL;
					}

					dist += low_dist;
				} else {
					/* dbits is one of [0,1,2,3] */
					int add;

					if(ARCHIVE_OK != (ret = read_consume_bits(a, rar,
					     p, dbits, &add))) {
						/* Return EOF if we can't read
						 * more data. */
						return ret;
					}

					dist += add;
				}
			}

			if(dist > 0x100) {
				len++;

				if(dist > 0x2000) {
					len++;

					if(dist > 0x40000) {
						len++;
					}
				}
			}

			dist_cache_push(rar, dist);
			rar->cstate.last_len = len;

			if(ARCHIVE_OK != copy_string(a, len, dist))
				return ARCHIVE_FATAL;

			continue;
		} else if(num == 256) {
			/* Create a filter. */
			ret = parse_filter(a, p);
			if(ret != ARCHIVE_OK)
				return ret;

			continue;
		} else if(num == 257) {
			if(rar->cstate.last_len != 0) {
				if(ARCHIVE_OK != copy_string(a,
				    rar->cstate.last_len,
				    rar->cstate.dist_cache[0]))
				{
					return ARCHIVE_FATAL;
				}
			}

			continue;
		} else {
			/* num < 262 */
			const int idx = num - 258;
			const int dist = dist_cache_touch(rar, idx);

			uint16_t len_slot;
			int len;

			if(ARCHIVE_OK != decode_number(a, &rar->cstate.rd, p,
			    &len_slot)) {
				return ARCHIVE_FATAL;
			}

			len = decode_code_length(a, rar, p, len_slot);
			if (len == -1) {
				return ARCHIVE_FATAL;
			}

			rar->cstate.last_len = len;

			if(ARCHIVE_OK != copy_string(a, len, dist))
				return ARCHIVE_FATAL;

			continue;
		}
	}

	return ARCHIVE_OK;
}